

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

float If_CutEdgeFlow(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  If_Cut_t *pIVar2;
  bool bVar3;
  float fVar4;
  int local_28;
  float local_24;
  int i;
  float Flow;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  local_24 = (float)(byte)pCut->field_0x1f;
  local_28 = 0;
  do {
    bVar3 = false;
    if (local_28 < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      _i = If_ManObj(p,(int)(&pCut[1].Area)[local_28]);
      bVar3 = _i != (If_Obj_t *)0x0;
    }
    if (!bVar3) {
      return local_24;
    }
    if (_i->nRefs == 0) {
LAB_0044e585:
      pIVar2 = If_ObjCutBest(_i);
      fVar4 = pIVar2->Edge;
    }
    else {
      iVar1 = If_ObjIsConst1(_i);
      if (iVar1 != 0) goto LAB_0044e585;
      if (_i->EstRefs < p->fEpsilon || _i->EstRefs == p->fEpsilon) {
        __assert_fail("pLeaf->EstRefs > p->fEpsilon",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifCut.c"
                      ,0x3c1,"float If_CutEdgeFlow(If_Man_t *, If_Cut_t *)");
      }
      pIVar2 = If_ObjCutBest(_i);
      fVar4 = pIVar2->Edge / _i->EstRefs;
    }
    local_24 = fVar4 + local_24;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

float If_CutEdgeFlow( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float Flow;
    int i;
    Flow = pCut->nLeaves;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        if ( pLeaf->nRefs == 0 || If_ObjIsConst1(pLeaf) )
            Flow += If_ObjCutBest(pLeaf)->Edge;
        else 
        {
            assert( pLeaf->EstRefs > p->fEpsilon );
            Flow += If_ObjCutBest(pLeaf)->Edge / pLeaf->EstRefs;
        }
    }
    return Flow;
}